

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void Server::signal_handler(int dunno)

{
  __pid_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (dunno == 10) {
    printf("Alive %d\t\tNew %d\t\tDelete %d\n",
           (ulong)(uint)(Client::client_new - Client::client_delete));
    return;
  }
  if (dunno == 2) {
    __val = getpid();
    std::__cxx11::to_string(&local_48,__val);
    std::operator+(&bStack_68,"/tmp/webed_",&local_48);
    std::operator+(&local_28,&bStack_68,".sock");
    unlink(local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    exit(0);
  }
  fprintf(_stderr,"%s:%d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",0xd0
         );
  fprintf(_stderr,"--> %s\n","-1");
  perror("info");
  exit(1);
}

Assistant:

void Server::signal_handler(int dunno) {
    switch (dunno) {
        case SIGUSR1:
            printf("Alive %d\t\tNew %d\t\tDelete %d\n", Client::client_new - Client::client_delete,
                   Client::client_new, Client::client_delete);
            break;
        case SIGINT:
            unlink(("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
            exit(0);
        default:
            IF_NEGATIVE_EXIT(-1);
    }
}